

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::~IfcCondition(IfcCondition *this,void **vtt)

{
  void **vtt_local;
  IfcCondition *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCondition,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCondition,_0UL> *)
             &(this->super_IfcGroup).super_IfcObject.field_0xe0,vtt + 0x17);
  IfcGroup::~IfcGroup(&this->super_IfcGroup,vtt + 1);
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}